

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void GUIDestroy(HGUI handle)

{
  operator_delete(*(void **)((long)handle + 0x10),0x41f80);
  ShaderProgramDestroy((ShaderProgram *)handle);
  if (*(long **)((long)handle + 0x1a0ca8) != (long *)((long)handle + 0x1a0cb8)) {
    operator_delete(*(long **)((long)handle + 0x1a0ca8),*(long *)((long)handle + 0x1a0cb8) + 1);
  }
  operator_delete(handle,0x1a0cc8);
  return;
}

Assistant:

void GUIDestroy(HGUI handle) {
    GUI* gui = (GUI*)handle;
    delete gui->Ctx;
    ShaderProgramDestroy(gui->Program);
    delete gui;
}